

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_cpio_svr4c_Z.c
# Opt level: O1

void test_read_format_cpio_svr4c_Z(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a;
  char *pcVar3;
  archive_entry *ae;
  archive_entry *local_30;
  
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                   ,L'(',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0)
  ;
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'*',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_open_memory(a,archive,0x71);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open_memory(a, archive, sizeof(archive))",a);
  iVar1 = archive_read_next_header(a,&local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  archive_filter_name(a,0);
  failure("archive_filter_name(a, 0)=\"%s\"");
  iVar1 = archive_filter_code(a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'2',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  pcVar3 = archive_format_name(a);
  failure("archive_format_name(a)=\"%s\"",pcVar3);
  iVar1 = archive_format(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'4',(long)iVar1,"archive_format(a)",0x10005,"ARCHIVE_FORMAT_CPIO_SVR4_CRC",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_30);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'5',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'6',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'7',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_cpio_svr4c_Z.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_cpio_svr4c_Z)
{
	struct archive_entry *ae;
	struct archive *a;
/*	printf("Archive address: start=%X, end=%X\n", archive, archive+sizeof(archive)); */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_memory(a, archive, sizeof(archive)));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	failure("archive_filter_name(a, 0)=\"%s\"",
	    archive_filter_name(a, 0));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	failure("archive_format_name(a)=\"%s\"", archive_format_name(a));
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_CPIO_SVR4_CRC);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}